

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

GCproto * check_Lproto(lua_State *L,int nolua)

{
  TValue *pTVar1;
  
  pTVar1 = L->base;
  if (pTVar1 < L->top) {
    if ((pTVar1->field_2).it == 0xfffffff7) {
      if (*(char *)((ulong)(pTVar1->u32).lo + 6) == '\0') {
        return (GCproto *)((ulong)*(uint *)((ulong)(pTVar1->u32).lo + 0x10) - 0x40);
      }
      if (nolua != 0) {
        return (GCproto *)0x0;
      }
    }
    else if ((pTVar1->field_2).it == 0xfffffff8) {
      return (GCproto *)(ulong)(pTVar1->u32).lo;
    }
  }
  lj_err_argt(L,1,6);
}

Assistant:

static GCproto *check_Lproto(lua_State *L, int nolua)
{
  TValue *o = L->base;
  if (L->top > o) {
    if (tvisproto(o)) {
      return protoV(o);
    } else if (tvisfunc(o)) {
      if (isluafunc(funcV(o)))
	return funcproto(funcV(o));
      else if (nolua)
	return NULL;
    }
  }
  lj_err_argt(L, 1, LUA_TFUNCTION);
  return NULL;  /* unreachable */
}